

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objinfo.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  string *__lhs;
  bool bVar1;
  Elf64_Addr EVar2;
  ostream *poVar3;
  char *pcVar4;
  Elf64_Addr value;
  Args args;
  elfio input;
  
  Args::parse(&args,argc,argv);
  loadElf(&input,&args.input);
  if (args.printHighestVaddr == true) {
    EVar2 = findHighestVaddr(&input);
    convertVma(EVar2,&args);
    poVar3 = std::operator<<((ostream *)&std::cout,"0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::operator<<(poVar3,'\n');
  }
  if (args.printLowestVaddr == true) {
    EVar2 = findLowestVaddr(&input);
    convertVma(EVar2,&args);
    poVar3 = std::operator<<((ostream *)&std::cout,"0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::operator<<(poVar3,'\n');
  }
  __lhs = &args.printSymbolValue;
  bVar1 = std::operator!=(__lhs,"");
  if (bVar1) {
    bVar1 = findSymbolValue(&input,__lhs,&value);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"0x");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      pcVar4 = "\n";
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"No symbol named ");
      poVar3 = std::operator<<(poVar3,(string *)__lhs);
      pcVar4 = " found.\n";
    }
    std::operator<<(poVar3,pcVar4);
  }
  if (args.printEntry == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    ELFIO::elfio::get_entry(&input);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::operator<<(poVar3,"\n");
  }
  ELFIO::elfio::~elfio(&input);
  Args::~Args(&args);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	try {
		Args args = Args::parse(argc, argv);
		auto input = loadElf(args.input);

		if(args.printHighestVaddr) {
			ELFIO::Elf64_Addr vaddr = convertVma(findHighestVaddr(input), args);
			std::cout << "0x" << std::hex << vaddr << std::dec << '\n';
		}
		if(args.printLowestVaddr) {
			ELFIO::Elf64_Addr vaddr = convertVma(findLowestVaddr(input), args);
			std::cout << "0x" << std::hex << vaddr << std::dec << '\n';
		}
		if(args.printSymbolValue != "") {
			ELFIO::Elf64_Addr value;
			if(findSymbolValue(input, args.printSymbolValue, value)) {
				std::cout << "0x" << std::hex << value << std::dec << "\n";
			} else {
				std::cerr << "No symbol named " << args.printSymbolValue << " found.\n";
			}
		}
		if(args.printEntry) {
			std::cout << "0x" << std::hex << input.get_entry() << std::dec << "\n";
		}

	} catch (TCLAP::ArgException &e) {
		std::cerr << "error: " << e.error() << " for arg " << e.argId() << std::endl;
		return 1;
	}

	return 0;
}